

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Resize
               (Image *in,uint32_t startXIn,uint32_t startYIn,uint32_t widthIn,uint32_t heightIn,
               Image *out,uint32_t startXOut,uint32_t startYOut,uint32_t widthOut,uint32_t heightOut
               )

{
  uchar *puVar1;
  uint uVar2;
  allocator_type *__a;
  reference pvVar3;
  uchar *puVar4;
  int in_ECX;
  int in_EDX;
  uint in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  int in_R8D;
  ImageTemplate<unsigned_char> *in_R9;
  uint in_stack_00000008;
  int in_stack_00000010;
  uint in_stack_00000018;
  uint in_stack_00000020;
  uint32_t *idX;
  uint8_t *outXEnd;
  uint8_t *outX;
  uint8_t *inX;
  uint32_t x;
  vector<unsigned_int,_std::allocator<unsigned_int>_> positionX;
  uint32_t idY;
  uint8_t *outYEnd;
  uint8_t *outY;
  uint8_t *inY;
  uint32_t rowSizeOut;
  uint32_t rowSizeIn;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff08;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  undefined1 *__n;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff30;
  ImageTemplate<unsigned_char> *this;
  uint *local_c0;
  uchar *local_b0;
  uint local_a0;
  undefined1 local_99;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  int local_7c;
  uchar *local_78;
  uchar *local_70;
  uchar *local_68;
  uint32_t local_5c;
  uint32_t local_58;
  ImageTemplate<unsigned_char> *local_20;
  int local_18;
  int local_14;
  int local_10;
  uint local_c;
  ImageTemplate<unsigned_char> *local_8;
  
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff30,(uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff28,
             (uint32_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff20);
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff30,(uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff28,
             (uint32_t)((ulong)in_stack_ffffffffffffff20 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff20);
  this = local_8;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x130369);
  local_58 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_8);
  local_5c = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(local_20);
  local_68 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_8);
  local_68 = local_68 + (ulong)local_c + (ulong)(local_10 * local_58);
  local_70 = PenguinV_Image::ImageTemplate<unsigned_char>::data(local_20);
  local_70 = local_70 + (ulong)in_stack_00000008 + (ulong)(in_stack_00000010 * local_5c);
  local_78 = local_70 + in_stack_00000020 * local_5c;
  local_7c = 0;
  __a = (allocator_type *)(ulong)in_stack_00000018;
  __n = &local_99;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x13043e);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this,(size_type)__n,__a);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x13045e);
  for (local_a0 = 0; local_a0 < in_stack_00000018; local_a0 = local_a0 + 1) {
    uVar2 = local_a0 * local_14;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_98,(ulong)local_a0);
    *pvVar3 = uVar2 / in_stack_00000018;
  }
  for (; puVar1 = local_68, local_70 != local_78; local_70 = local_70 + local_5c) {
    uVar2 = ((uint)(local_7c * local_18) / in_stack_00000020) * local_58;
    local_b0 = local_70;
    puVar4 = local_70 + in_stack_00000018;
    local_c0 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x13057a);
    for (; local_b0 != puVar4; local_b0 = local_b0 + 1) {
      *local_b0 = puVar1[(ulong)*local_c0 + (ulong)uVar2];
      local_c0 = local_c0 + 1;
    }
    local_7c = local_7c + 1;
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)__a);
  return;
}

Assistant:

void Resize( const Image & in, uint32_t startXIn, uint32_t startYIn, uint32_t widthIn, uint32_t heightIn,
                 Image & out, uint32_t startXOut, uint32_t startYOut, uint32_t widthOut, uint32_t heightOut )
    {
        ParameterValidation( in, startXIn, startYIn, widthIn, heightIn );
        ParameterValidation( out, startXOut, startYOut, widthOut, heightOut );
        VerifyGrayScaleImage( in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + heightOut * rowSizeOut;

        uint32_t idY = 0;

        // Precalculation of X position
        std::vector < uint32_t > positionX( widthOut );
        for( uint32_t x = 0; x < widthOut; ++x )
            positionX[x] = x * widthIn / widthOut;

        for( ; outY != outYEnd; outY += rowSizeOut, ++idY ) {
            const uint8_t * inX  = inY + (idY * heightIn / heightOut) * rowSizeIn;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + widthOut;

            const uint32_t * idX = positionX.data();

            for( ; outX != outXEnd; ++outX, ++idX )
                (*outX) = *(inX + (*idX));
        }
    }